

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O1

void collect_nodes(TreeNode *tn,dl_t nlist)

{
  uint uVar1;
  dl_el *pdVar2;
  dl_el_s *pdVar3;
  dl_el *pdVar4;
  dl_el_s *pdVar5;
  dl_el_s *pdVar6;
  
  pdVar5 = (dl_el_s *)malloc(0x18);
  if (pdVar5 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
  }
  else {
    pdVar5[1].prev = (dl_el_s *)tn;
    pdVar5->next = (dl_el_s *)0x0;
    uVar1 = nlist->count;
    if (uVar1 == 0) {
      pdVar5->prev = (dl_el_s *)0x0;
      nlist->last = pdVar5;
      nlist->first = pdVar5;
      nlist->count = 1;
    }
    else {
      pdVar2 = nlist->last;
      pdVar5->prev = pdVar2;
      pdVar2->next = pdVar5;
      nlist->last = pdVar5;
      nlist->count = uVar1 + 1;
    }
  }
  for (pdVar2 = nlist->last; pdVar2 != (dl_el *)0x0; pdVar2 = pdVar2->next) {
    pdVar5 = (pdVar2[1].prev)->next->prev;
    while (pdVar5 != (dl_el_s *)0x0) {
      pdVar3 = pdVar5[1].prev;
      pdVar5 = pdVar5->next;
      pdVar6 = (dl_el_s *)malloc(0x18);
      if (pdVar6 == (dl_el_s *)0x0) {
        puts("Out of memory!!");
      }
      else {
        pdVar6[1].prev = pdVar3;
        pdVar6->next = (dl_el_s *)0x0;
        uVar1 = nlist->count;
        if (uVar1 == 0) {
          pdVar6->prev = (dl_el_s *)0x0;
          nlist->last = pdVar6;
          nlist->first = pdVar6;
          nlist->count = 1;
        }
        else {
          pdVar4 = nlist->last;
          pdVar6->prev = pdVar4;
          pdVar4->next = pdVar6;
          nlist->last = pdVar6;
          nlist->count = uVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void collect_nodes(TreeNode* tn, dl_t nlist)
{
  /*
  TreeNode* c;
  
  dl_append(TreeNode*, nlist, tn);
  dl_forall(TreeNode*, tn->children, c) {
    collect_nodes(c, nlist);
  }dl_endfor;
  */
  // non-recursive version
  TreeNode* c;
  dl_el *curr;
  
  dl_append(TreeNode*, nlist, tn);

  for (curr=nlist->last; curr; curr=curr->next) {
    tn = dl_data(TreeNode*, curr);
    dl_forall(TreeNode*, tn->children, c) {
      dl_append(TreeNode*, nlist, c);
    }dl_endfor;
  }
}